

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O0

size_t __thiscall
COLLADASaxFWL::FormulasLinker::getNewParamIndex
          (FormulasLinker *this,Formula *formula,String *parameterName,bool *found)

{
  __type _Var1;
  FormulaNewParamPointerArray *pFVar2;
  size_t sVar3;
  FormulaNewParam **ppFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  Formula *in_RSI;
  FormulaNewParam *newParam;
  size_t count;
  size_t i;
  FormulaNewParamPointerArray *newParams;
  size_t local_38;
  
  pFVar2 = COLLADAFW::Formula::getNewParams(in_RSI);
  local_38 = 0;
  sVar3 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>::getCount
                    (&pFVar2->super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>);
  while( true ) {
    if (sVar3 <= local_38) {
      in_RCX->_M_dataplus = (_Alloc_hider)0x0;
      return 0;
    }
    ppFVar4 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>::operator[]
                        (&pFVar2->super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>,local_38);
    COLLADAFW::FormulaNewParam::getName_abi_cxx11_(*ppFVar4);
    _Var1 = std::operator==(in_RDX,in_RCX);
    if (_Var1) break;
    local_38 = local_38 + 1;
  }
  in_RCX->_M_dataplus = (_Alloc_hider)0x1;
  return local_38;
}

Assistant:

size_t FormulasLinker::getNewParamIndex(const COLLADAFW::Formula* formula, const String& parameterName, bool &found)
	{
		const COLLADAFW::FormulaNewParamPointerArray& newParams = formula->getNewParams();
		for ( size_t i = 0, count = newParams.getCount(); i < count; ++i)
		{
			const COLLADAFW::FormulaNewParam* newParam = newParams[i];
			if ( newParam->getName() == parameterName )
			{
				found = true;
				return i;
			}
		}
		found = false;
		return 0;
	}